

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::get_complexity_per_elem_tmpl<1,1>(Omega_h *this,Mesh *mesh,Reals *v2m)

{
  LO LVar1;
  Int ent_dim;
  void *extraout_RDX;
  Reals RVar2;
  Reals elem_metrics;
  Write<double> out_w;
  Reals coords;
  LOs elems2verts;
  type f;
  Write<double> WStack_c8;
  Write<double> local_b8;
  Write<double> local_a8;
  Write<double> local_98;
  undefined1 local_88 [32];
  type local_68;
  
  Mesh::ask_elem_verts((Mesh *)(local_88 + 0x10));
  Mesh::coords((Mesh *)local_88);
  LVar1 = Mesh::nelems(mesh);
  std::__cxx11::string::string((string *)&local_68,"",(allocator *)&WStack_c8);
  Write<double>::Write(&local_b8,LVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  ent_dim = Mesh::dim(mesh);
  Write<double>::Write(&local_98,&v2m->write_);
  get_mident_metrics((Omega_h *)&WStack_c8,mesh,ent_dim,(Reals *)&local_98,false);
  Write<double>::~Write(&local_98);
  Write<int>::Write((Write<int> *)&local_68,(Write<int> *)(local_88 + 0x10));
  Write<double>::Write(&local_68.coords.write_,(Write<double> *)local_88);
  Write<double>::Write(&local_68.elem_metrics.write_,&WStack_c8);
  Write<double>::Write(&local_68.out_w,&local_b8);
  LVar1 = Mesh::nelems(mesh);
  parallel_for<Omega_h::get_complexity_per_elem_tmpl<1,1>(Omega_h::Mesh*,Omega_h::Read<double>)::_lambda(int)_1_>
            (LVar1,&local_68);
  Write<double>::Write(&local_a8,&local_b8);
  Read<double>::Read((Read<signed_char> *)this,&local_a8);
  Write<double>::~Write(&local_a8);
  get_complexity_per_elem_tmpl<1,1>(Omega_h::Mesh*,Omega_h::Read<double>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)&local_68);
  Write<double>::~Write(&WStack_c8);
  Write<double>::~Write(&local_b8);
  Write<double>::~Write((Write<double> *)local_88);
  Write<int>::~Write((Write<int> *)(local_88 + 0x10));
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_complexity_per_elem_tmpl(Mesh* mesh, Reals v2m) {
  auto const elems2verts = mesh->ask_elem_verts();
  auto const coords = mesh->coords();
  auto const out_w = Write<Real>(mesh->nelems());
  auto const elem_metrics = get_mident_metrics(mesh, mesh->dim(), v2m);
  auto f = OMEGA_H_LAMBDA(LO const e) {
    auto const v = gather_verts<mesh_dim + 1>(elems2verts, e);
    auto const p = gather_vectors<mesh_dim + 1, mesh_dim>(coords, v);
    auto const b = simplex_basis<mesh_dim, mesh_dim>(p);
    auto const real_volume = simplex_size_from_basis(b);
    auto const m = get_symm<metric_dim>(elem_metrics, e);
    auto const sqrt_metric_det =
        power<mesh_dim, 2 * metric_dim>(determinant(m));
    out_w[e] = real_volume * sqrt_metric_det;
  };
  parallel_for(mesh->nelems(), std::move(f));
  return Reals(out_w);
}